

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::LoadFuncExpression(Lowerer *this,Instr *instrFuncExpr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Opnd *newSrc;
  
  bVar2 = Func::IsInlinee(instrFuncExpr->m_func);
  if ((instrFuncExpr->m_func == this->m_func) == bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x356b,
                       "(instrFuncExpr->m_func->IsInlinee() ? (instrFuncExpr->m_func != this->m_func) : (instrFuncExpr->m_func == this->m_func))"
                       ,
                       "instrFuncExpr->m_func->IsInlinee() ? (instrFuncExpr->m_func != this->m_func) : (instrFuncExpr->m_func == this->m_func)"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  newSrc = GetFuncObjectOpnd(this,instrFuncExpr);
  IR::Instr::SetSrc1(instrFuncExpr,newSrc);
  LowererMD::ChangeToAssign(instrFuncExpr);
  return instrFuncExpr;
}

Assistant:

IR::Instr *
Lowerer::LoadFuncExpression(IR::Instr *instrFuncExpr)
{
    ASSERT_INLINEE_FUNC(instrFuncExpr);
    IR::Opnd *paramOpnd = GetFuncObjectOpnd(instrFuncExpr);

    // mov dst, param
    instrFuncExpr->SetSrc1(paramOpnd);
    LowererMD::ChangeToAssign(instrFuncExpr);

    return instrFuncExpr;
}